

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O1

void avro::schema::testCompile(char *schema)

{
  undefined1 *puVar1;
  size_t sVar2;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8 [8];
  shared_count local_1c0;
  undefined1 local_1b8 [16];
  _func_int *local_1a8 [12];
  ios_base local_148 [264];
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  memset((ostringstream *)local_1b8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  if (schema == (char *)0x0) {
    std::ios::clear((int)local_1e8 + (int)*(_func_int **)(local_1b8._0_8_ + -0x18) + 0x30);
  }
  else {
    sVar2 = strlen(schema);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,schema,sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_40,(string *)local_1e8);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  puVar1 = local_40;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b09c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x99;
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,schema,(allocator<char> *)local_1e8);
  avro::compileJsonSchemaFromString(local_1c8);
  boost::detail::shared_count::~shared_count(&local_1c0);
  if ((_func_int **)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8[0] + 1));
  }
  return;
}

Assistant:

static void testCompile(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    compileJsonSchemaFromString(std::string(schema));
}